

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * __thiscall
iutest::detail::FormatIntWidthN_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,int value,int digit)

{
  long lVar1;
  int iVar2;
  allocator<char> local_a5;
  int local_a4;
  int local_a0;
  int i;
  int x;
  int idx;
  char buf [128];
  int digit_local;
  int value_local;
  
  buf._124_4_ = SUB84(this,0);
  buf._120_4_ = value;
  memset(&x,0,0x80);
  i = 0x7e;
  local_a0._0_1_ = buf[0x7c];
  local_a0._1_1_ = buf[0x7d];
  local_a0._2_1_ = buf[0x7e];
  local_a0._3_1_ = buf[0x7f];
  for (local_a4 = 0; local_a4 < (int)buf._120_4_; local_a4 = local_a4 + 1) {
    iVar2 = local_a0 % 10;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    *(char *)((long)&x + (long)i) = (char)iVar2 + '0';
    local_a0 = local_a0 / 10;
    i = i + -1;
  }
  for (; local_a0 != 0; local_a0 = local_a0 / 10) {
    iVar2 = local_a0 % 10;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    *(char *)((long)&x + (long)i) = (char)iVar2 + '0';
    i = i + -1;
  }
  if ((int)buf._124_4_ < 0) {
    *(undefined1 *)((long)&x + (long)i) = 0x2d;
    i = i + -1;
  }
  lVar1 = (long)i;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)((long)&x + lVar1 + 1),&local_a5);
  std::allocator<char>::~allocator(&local_a5);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatIntWidthN(int value, int digit)
{
    char buf[128] = { 0 };
    int idx = IUTEST_PP_COUNTOF(buf) - 2;
    int x = value;
    for( int i=0; i < digit; ++i, --idx )
    {
        buf[idx] = static_cast<char>(::std::abs(x%10) + '0');
        x /= 10;
    }
    for( ; x; --idx )
    {
        buf[idx] = static_cast<char>(::std::abs(x%10) + '0');
        x /= 10;
    }
    if( value < 0 )
    {
        buf[idx--] = '-';
    }
    return buf + idx + 1;
}